

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall ccs::CcsContext::Builder::Builder(Builder *this,Builder *that)

{
  Impl *this_00;
  type pIVar1;
  Builder *that_local;
  Builder *this_local;
  
  this_00 = (Impl *)operator_new(0x48);
  pIVar1 = std::
           unique_ptr<ccs::CcsContext::Builder::Impl,_std::default_delete<ccs::CcsContext::Builder::Impl>_>
           ::operator*(&that->impl);
  Impl::Impl(this_00,pIVar1);
  std::
  unique_ptr<ccs::CcsContext::Builder::Impl,std::default_delete<ccs::CcsContext::Builder::Impl>>::
  unique_ptr<std::default_delete<ccs::CcsContext::Builder::Impl>,void>
            ((unique_ptr<ccs::CcsContext::Builder::Impl,std::default_delete<ccs::CcsContext::Builder::Impl>>
              *)this,this_00);
  return;
}

Assistant:

CcsContext::Builder::Builder(const Builder &that) :
    impl(new Impl(*that.impl)) {}